

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference ppTVar5;
  TestSuite *test_suite_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2_1;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  TestSuite *local_70;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int total_tests;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string kTestsuites;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = test_suites;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"testsuites",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar4 = std::operator<<(stream,"<");
  std::operator<<(poVar4,(string *)local_38);
  uVar1 = kTestsuites.field_2._8_8_;
  __range2._0_4_ = 0;
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                      kTestsuites.field_2._8_8_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                          uVar1);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                      (&__end2,(__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                *)&test_suite);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppTVar5 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    local_70 = *ppTVar5;
    iVar3 = TestSuite::total_test_count(local_70);
    __range2._0_4_ = iVar3 + (int)__range2;
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"tests",&local_91);
  StreamableToString<int>(&local_b8,(int *)&__range2);
  OutputXmlAttribute(stream,(string *)local_38,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"name",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"AllTests",(allocator<char> *)((long)&__range2_1 + 7));
  OutputXmlAttribute(stream,(string *)local_38,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::operator<<(stream,">\n");
  uVar1 = kTestsuites.field_2._8_8_;
  __end2_1 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                       ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                        kTestsuites.field_2._8_8_);
  test_suite_1 = (TestSuite *)
                 std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                           ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                            uVar1);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                      (&__end2_1,
                       (__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)&test_suite_1);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppTVar5 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2_1);
    PrintXmlTestSuite(stream,*ppTVar5);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2_1);
  }
  poVar4 = std::operator<<(stream,"</");
  poVar4 = std::operator<<(poVar4,(string *)local_38);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (auto test_suite : test_suites) {
    PrintXmlTestSuite(stream, *test_suite);
  }
  *stream << "</" << kTestsuites << ">\n";
}